

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadANIM(B3DImporter *this)

{
  int iVar1;
  tuple<aiAnimation_*,_std::default_delete<aiAnimation>_> tVar2;
  float fVar3;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  __uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_> local_28;
  
  ReadInt(this);
  iVar1 = ReadInt(this);
  fVar3 = ReadFloat(this);
  tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>)operator_new(0x448);
  *(undefined4 *)
   tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
   super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl = 0;
  *(undefined1 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 4) = 0;
  memset((void *)((long)tVar2.
                        super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                        super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(undefined4 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418) = 0;
  *(undefined8 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined4 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x428) = 0;
  *(undefined8 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x430) = 0;
  *(undefined4 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x438) = 0;
  *(undefined8 *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x440) = 0;
  *(double *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x408) = (double)iVar1;
  *(double *)
   ((long)tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x410) = (double)fVar3;
  local_28._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (tuple<aiAnimation_*,_std::default_delete<aiAnimation>_>)
       (tuple<aiAnimation_*,_std::default_delete<aiAnimation>_>)
       tVar2.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
       super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
  ::emplace_back<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>
            ((vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
              *)&this->_animations,
             (unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_28);
  std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr
            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_28);
  return;
}

Assistant:

void B3DImporter::ReadANIM(){
    /*int flags=*/ReadInt();
    int frames=ReadInt();
    float fps=ReadFloat();

    std::unique_ptr<aiAnimation> anim(new aiAnimation);

    anim->mDuration=frames;
    anim->mTicksPerSecond=fps;
    _animations.emplace_back( std::move(anim) );
}